

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devices.cpp
# Opt level: O2

void __thiscall CDevice::CheckPage(CDevice *this,ECheckPageLevel level)

{
  int badValue;
  ESlotOptions EVar1;
  CDeviceSlot *pCVar2;
  CDeviceSlot *pCVar3;
  CDevicePage *pCVar4;
  int iVar5;
  aint aVar6;
  char cVar7;
  int iVar8;
  int *piVar9;
  char *message;
  int iVar10;
  int iVar11;
  long lVar12;
  bool bVar14;
  char buf [64];
  long lVar13;
  
  if (0xffff < CurAddress && (level != CHECK_NO_EMIT && PseudoORG != DISP_NONE)) {
    if (pass == 3) {
      snprintf(buf,0x40,"RAM limit exceeded 0x%X by DISP");
      Warning(buf,(char *)0x0,W_PASS3);
      CurAddress = CurAddress & 0xffff;
    }
    CurAddress = CurAddress & 0xffff;
  }
  aVar6 = CurAddress;
  iVar5 = adrdisp;
  piVar9 = &adrdisp;
  iVar8 = adrdisp;
  if (PseudoORG == DISP_NONE) {
    iVar8 = CurAddress;
  }
  if (level != CHECK_RESET) {
    iVar10 = this->Slots[this->previousSlotI]->Address;
    if ((iVar10 <= iVar8) && (iVar8 < iVar10 + this->Slots[this->previousSlotI]->Size)) {
      return;
    }
  }
  lVar13 = (long)this->SlotsCount;
  do {
    lVar12 = lVar13 + -1;
    if (lVar13 == 0) {
      Error("CheckPage(..): please, contact the author of this program.",(char *)0x0,FATAL);
      return;
    }
    pCVar2 = this->Slots[lVar13 + -1];
    iVar10 = pCVar2->Address;
    lVar13 = lVar12;
  } while (iVar8 < iVar10);
  Page = pCVar2->Page;
  MemoryPointer = Page->RAM + (iVar8 - iVar10);
  iVar11 = (int)lVar12;
  if (level == CHECK_RESET) {
    this->previousSlotOpt = pCVar2->Option;
    this->previousSlotI = iVar11;
    this->limitExceeded = false;
    return;
  }
  badValue = this->previousSlotI;
  iVar10 = iVar10 + pCVar2->Size;
  if ((badValue == iVar11) && (iVar8 < iVar10)) {
    return;
  }
  if (iVar10 <= iVar8) {
    MemoryPointer = (byte *)0x0;
  }
  EVar1 = this->previousSlotOpt;
  if (EVar1 == O_NEXT) {
    pCVar3 = this->Slots[badValue];
    iVar10 = pCVar3->Page->Number;
    if (iVar10 + 1 < this->PagesCount) {
      iVar8 = iVar8 - (pCVar3->Address + pCVar3->Size);
      if (iVar8 == 0) {
        bVar14 = PseudoORG == DISP_NONE;
        pCVar4 = this->Pages[(long)iVar10 + 1];
        pCVar3->Page = pCVar4;
        if (bVar14) {
          piVar9 = &CurAddress;
          iVar5 = aVar6;
        }
        Page = pCVar4;
        *piVar9 = iVar5 - pCVar3->Size;
        MemoryPointer = pCVar4->RAM;
        return;
      }
      ErrorInt("Write beyond memory slot in wrap-around slot catched too late by",iVar8,FATAL);
    }
    else {
      ErrorInt("No more memory pages to map next one into slot",badValue,SUPPRESS);
      pCVar3->Option = O_NONE;
      this->limitExceeded = false;
      this->previousSlotI = iVar11;
      this->previousSlotOpt = pCVar2->Option;
    }
LAB_0010a6b3:
    if (level != CHECK_EMIT) {
      return;
    }
    cVar7 = this->limitExceeded;
  }
  else {
    if (EVar1 == O_WARNING) {
      if ((level != CHECK_EMIT) || (pass != 3)) goto LAB_0010a6b3;
      cVar7 = this->limitExceeded;
      if ((bool)cVar7 != false) goto LAB_0010a6be;
      Warning("Write outside of memory slot",(char *)0x0,W_PASS3);
    }
    else {
      if (EVar1 == O_ERROR) {
        if ((level != CHECK_EMIT) || (pass != 3)) goto LAB_0010a6b3;
        cVar7 = this->limitExceeded;
        if ((bool)cVar7 != false) goto LAB_0010a6be;
        message = "Write outside of memory slot";
      }
      else {
        if ((level != CHECK_EMIT) || (pass != 3)) goto LAB_0010a6b3;
        cVar7 = this->limitExceeded;
        if (((bool)cVar7 != false) || (MemoryPointer != (byte *)0x0)) goto LAB_0010a6be;
        message = "Write outside of device memory at";
      }
      ErrorInt(message,iVar8,SUPPRESS);
    }
    cVar7 = '\x01';
  }
LAB_0010a6be:
  this->limitExceeded = cVar7 != '\0' && this->previousSlotI == iVar11;
  this->previousSlotI = iVar11;
  this->previousSlotOpt = pCVar2->Option;
  return;
}

Assistant:

void CDevice::CheckPage(const ECheckPageLevel level) {
	// fake DISP address gets auto-wrapped FFFF->0 (with warning only)
	// only with "emit" mode, labels may get the value 0x10000 before the address gets truncated
	if (DISP_NONE != PseudoORG && CHECK_NO_EMIT != level && 0x10000 <= CurAddress) {
		if (LASTPASS == pass) {
			char buf[64];
			SPRINTF1(buf, 64, "RAM limit exceeded 0x%X by DISP", (unsigned int)CurAddress);
			Warning(buf);
		}
		CurAddress &= 0xFFFF;
	}
	// check the emit address for bytecode
	const int realAddr = DISP_NONE != PseudoORG ? adrdisp : CurAddress;
	// quicker check to avoid scanning whole slots array every byte
	if (CHECK_RESET != level
		&& Slots[previousSlotI]->Address <= realAddr
		&& realAddr < Slots[previousSlotI]->Address + Slots[previousSlotI]->Size) return;
	for (int i=SlotsCount; i--; ) {
		CDeviceSlot* const S = Slots[i];
		if (realAddr < S->Address) continue;
		Page = S->Page;
		MemoryPointer = Page->RAM + (realAddr - S->Address);
 		if (CHECK_RESET == level) {
			previousSlotOpt = S->Option;
			previousSlotI = i;
			limitExceeded = false;
			return;
		}
		// if still in the same slot and within boundaries, we are done
		if (i == previousSlotI && realAddr < S->Address + S->Size) return;
		// crossing into other slot, check options for special functionality of old slot
		if (S->Address + S->Size <= realAddr) MemoryPointer = nullptr; // you're not writing there
		switch (previousSlotOpt) {
			case CDeviceSlot::O_ERROR:
				if (LASTPASS == pass && CHECK_EMIT == level && !limitExceeded) {
					ErrorInt("Write outside of memory slot", realAddr, SUPPRESS);
					limitExceeded = true;
				}
				break;
			case CDeviceSlot::O_WARNING:
				if (LASTPASS == pass && CHECK_EMIT == level && !limitExceeded) {
					Warning("Write outside of memory slot");
					limitExceeded = true;
				}
				break;
			case CDeviceSlot::O_NEXT:
			{
				CDeviceSlot* const prevS = Slots[previousSlotI];
				const int nextPageN = prevS->Page->Number + 1;
				if (PagesCount <= nextPageN) {
					ErrorInt("No more memory pages to map next one into slot", previousSlotI, SUPPRESS);
					// disable the option on the overflowing slot
					prevS->Option = CDeviceSlot::O_NONE;
					// reset error reporting even when level is CHECK_NO_EMIT, one error is enough
					limitExceeded = false;
					previousSlotI = i;
					previousSlotOpt = S->Option;
					break;		// continue into next slot, don't wrap any more
				}
				if (realAddr != (prevS->Address + prevS->Size)) {	// should be equal
					ErrorInt("Write beyond memory slot in wrap-around slot catched too late by",
								realAddr - prevS->Address - prevS->Size, FATAL);
					break;
				}
				prevS->Page = Pages[nextPageN];		// map next page into the guarded slot
				Page = prevS->Page;
				if (DISP_NONE != PseudoORG) adrdisp -= prevS->Size;
				else CurAddress -= prevS->Size;
				MemoryPointer = Page->RAM;
				return;		// preserve current option status
			}
			default:
				if (LASTPASS == pass && CHECK_EMIT == level && !limitExceeded && !MemoryPointer) {
					ErrorInt("Write outside of device memory at", realAddr, SUPPRESS);
					limitExceeded = true;
				}
				break;
		}
		// refresh check slot settings (only in CHECK_EMIT case, otherwise ParseLine will reset it with CHECK_NO_EMIT at BoL!)
		if (CHECK_EMIT == level) {
			limitExceeded &= (previousSlotI == i);	// reset limit flag if slot changed (in non check_reset mode)
			previousSlotI = i;
			previousSlotOpt = S->Option;
		}
		return;
	}
	Error("CheckPage(..): please, contact the author of this program.", nullptr, FATAL);
}